

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O1

void __thiscall
deqp::gls::RandomShaderProgram::shadeFragments
          (RandomShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  ExecutionContext *this_00;
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  Scalar SVar4;
  GenericVec4 *pGVar5;
  uint uVar6;
  VariableType *this_01;
  pointer ppSVar7;
  VariableType *this_02;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int fragNdx;
  long lVar13;
  Shader *this_03;
  int fragNdx_1;
  FragmentPacket *packet;
  int iVar14;
  Scalar *pSVar15;
  long lVar16;
  ExecValueAccess EVar17;
  ExecValueAccess EVar18;
  Vec4 varValue;
  Scalar local_48;
  Scalar local_44;
  Scalar local_40;
  Scalar local_3c;
  FragmentPacket *local_38;
  
  this_00 = &this->m_execCtx;
  local_38 = packets;
  EVar17 = rsg::ExecutionContext::getValue(this_00,this->m_fragColorVar);
  this_01 = EVar17.super_ConstStridedValueAccess<64>.m_type;
  if (0 < numPackets) {
    iVar10 = 0;
    do {
      uVar12 = numPackets - iVar10;
      uVar6 = 0x10;
      if ((int)uVar12 < 0x10) {
        uVar6 = uVar12;
      }
      this_03 = this->m_fragmentShader;
      ppSVar7 = (this_03->m_inputs).
                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this_03->m_inputs).
                                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7) >> 3))
      {
        uVar11 = 1;
        if (1 < (int)uVar6) {
          uVar11 = (ulong)uVar6;
        }
        lVar16 = 0;
        do {
          iVar14 = (ppSVar7[lVar16]->m_variable->m_type).m_numElements;
          EVar18 = rsg::ExecutionContext::getValue(this_00,ppSVar7[lVar16]->m_variable);
          this_02 = EVar18.super_ConstStridedValueAccess<64>.m_type;
          if (0 < (int)uVar12) {
            pSVar15 = EVar18.super_ConstStridedValueAccess<64>.m_value + 0xc0;
            uVar9 = 0;
            do {
              packet = local_38 + (iVar10 + (int)uVar9);
              lVar13 = 0;
              do {
                rr::readVarying<float>
                          ((rr *)&local_48.boolVal,packet,context,(int)lVar16,(int)lVar13);
                SVar1 = local_48;
                rsg::VariableType::getElementType(this_02);
                SVar2 = local_44;
                pSVar15[lVar13 + -0xc0] = SVar1;
                if (1 < iVar14) {
                  rsg::VariableType::getElementType(this_02);
                  pSVar15[lVar13 + -0x80] = SVar2;
                }
                SVar1 = local_40;
                if (2 < iVar14) {
                  rsg::VariableType::getElementType(this_02);
                  pSVar15[lVar13 + -0x40] = SVar1;
                }
                SVar1 = local_3c;
                if (3 < iVar14) {
                  rsg::VariableType::getElementType(this_02);
                  pSVar15[lVar13] = SVar1;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
              uVar9 = uVar9 + 1;
              pSVar15 = pSVar15 + 4;
            } while (uVar9 != uVar11);
          }
          lVar16 = lVar16 + 1;
          this_03 = this->m_fragmentShader;
          ppSVar7 = (this_03->m_inputs).
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (lVar16 < (int)((ulong)((long)(this_03->m_inputs).
                                              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppSVar7) >> 3));
      }
      rsg::Shader::execute(this_03,this_00);
      if (0 < (int)uVar12) {
        uVar11 = 1;
        if (1 < (int)uVar6) {
          uVar11 = (ulong)uVar6;
        }
        iVar14 = iVar10 * 4;
        uVar9 = 0;
        pSVar15 = EVar17.super_ConstStridedValueAccess<64>.m_value + 0xc0;
        do {
          lVar16 = 0;
          do {
            rsg::VariableType::getElementType(this_01);
            SVar1 = pSVar15[lVar16 + -0xc0];
            rsg::VariableType::getElementType(this_01);
            SVar2 = pSVar15[lVar16 + -0x80];
            rsg::VariableType::getElementType(this_01);
            SVar3 = pSVar15[lVar16 + -0x40];
            rsg::VariableType::getElementType(this_01);
            SVar4 = pSVar15[lVar16];
            pGVar5 = context->outputArray;
            iVar8 = (iVar14 + (int)lVar16) * context->numFragmentOutputs;
            *(Scalar *)(pGVar5 + iVar8) = SVar1;
            *(Scalar *)(pGVar5[iVar8].v.uData + 1) = SVar2;
            *(Scalar *)(pGVar5[iVar8].v.uData + 2) = SVar3;
            *(Scalar *)(pGVar5[iVar8].v.uData + 3) = SVar4;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          uVar9 = uVar9 + 1;
          iVar14 = iVar14 + 4;
          pSVar15 = pSVar15 + 4;
        } while (uVar9 != uVar11);
      }
      iVar10 = uVar6 + iVar10;
    } while (iVar10 < numPackets);
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const rsg::ExecConstValueAccess	fragColorAccess	= m_execCtx.getValue(m_fragColorVar);
	int								packetOffset	= 0;

	DE_STATIC_ASSERT(rsg::EXEC_VEC_WIDTH % rr::NUM_FRAGMENTS_PER_PACKET == 0);

	while (packetOffset < numPackets)
	{
		const int	numPacketsToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH / (int)rr::NUM_FRAGMENTS_PER_PACKET);

		// Interpolate varyings.
		for (int varNdx = 0; varNdx < (int)m_fragmentShader.getInputs().size(); ++varNdx)
		{
			const rsg::Variable*		var				= m_fragmentShader.getInputs()[varNdx]->getVariable();
			const rsg::VariableType&	varType			= var->getType();
			const int					numComponents	= varType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
			{
				const rr::FragmentPacket&	packet		= packets[packetOffset+packetNdx];

				for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
				{
					const tcu::Vec4		varValue	= rr::readVarying<float>(packet, context, varNdx, fragNdx);
					const int			dstNdx		= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;

											access.component(0).asFloat(dstNdx) = varValue[0];
					if (numComponents >= 2)	access.component(1).asFloat(dstNdx) = varValue[1];
					if (numComponents >= 3)	access.component(2).asFloat(dstNdx) = varValue[2];
					if (numComponents >= 4)	access.component(3).asFloat(dstNdx) = varValue[3];
				}
			}
		}

		m_fragmentShader.execute(m_execCtx);

		// Store color
		for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
			{
				const int		srcNdx	= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;
				const tcu::Vec4 color	(fragColorAccess.component(0).asFloat(srcNdx),
										 fragColorAccess.component(1).asFloat(srcNdx),
										 fragColorAccess.component(2).asFloat(srcNdx),
										 fragColorAccess.component(3).asFloat(srcNdx));

				rr::writeFragmentOutput(context, packetOffset+packetNdx, fragNdx, 0, color);
			}
		}

		packetOffset += numPacketsToExecute;
	}
}